

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-xthread-test.c++
# Opt level: O2

Own<const_kj::Executor,_std::nullptr_t> kj::anon_unknown_0::makeDeadExecutor(void)

{
  Disposer *pDVar1;
  Executor *pEVar2;
  bool bVar3;
  Executor *extraout_RDX;
  Disposer *in_RDI;
  Own<const_kj::Executor,_std::nullptr_t> OVar4;
  anon_class_1_0_00000001 local_a9;
  Maybe<kj::Own<const_kj::Executor,_std::nullptr_t>_> ownExecutor;
  Own<const_kj::Executor,_std::nullptr_t> local_98;
  Locked<kj::Maybe<const_kj::Executor_&>_> lock;
  PredicateImpl impl;
  Thread thread;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_48;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> executor;
  
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::MutexGuarded<>(&executor);
  ownExecutor.ptr.disposer = (Disposer *)0x0;
  ownExecutor.ptr.ptr = (Executor *)0x0;
  local_48.ptr = (Iface *)operator_new(0x10);
  (local_48.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00583880;
  local_48.ptr[1]._vptr_Iface = (_func_int **)&executor;
  local_48.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::makeDeadExecutor()::$_0>>
        ::instance;
  Thread::Thread(&thread,(Function<void_()> *)&local_48);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_48);
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&lock,&executor);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_00583918;
  impl.condition = &local_a9;
  impl.value = lock.ptr;
  local_98.disposer._0_1_ = 0;
  kj::_::Mutex::wait(lock.mutex,&impl);
  if ((lock.ptr)->ptr == (Executor *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&impl,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x459,FAILED,"*lock != nullptr","");
  }
  else {
    (**(lock.ptr)->ptr->_vptr_Executor)(&local_98);
    impl.super_Predicate._vptr_Predicate =
         (_func_int **)CONCAT71(local_98.disposer._1_7_,local_98.disposer._0_1_);
    impl.condition = (anon_class_1_0_00000001 *)local_98.ptr;
    local_98.ptr = (Executor *)0x0;
    Own<const_kj::Executor,_std::nullptr_t>::operator=
              (&ownExecutor.ptr,(Own<const_kj::Executor,_std::nullptr_t> *)&impl);
    Own<const_kj::Executor,_std::nullptr_t>::dispose
              ((Own<const_kj::Executor,_std::nullptr_t> *)&impl);
    Own<const_kj::Executor,_std::nullptr_t>::dispose(&local_98);
    if (ownExecutor.ptr.ptr != (Executor *)0x0) {
      bVar3 = Executor::isLive(ownExecutor.ptr.ptr);
      impl.super_Predicate._vptr_Predicate._0_1_ = bVar3;
      if (kj::_::Debug::minSeverity < 3 && !bVar3) {
        kj::_::Debug::log<char_const(&)[58],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
                   ,0x45b,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(ownExecutor)->isLive()\", _kjCondition"
                   ,(char (*) [58])"failed: expected KJ_ASSERT_NONNULL(ownExecutor)->isLive()",
                   (DebugExpression<bool> *)&impl);
      }
      (lock.ptr)->ptr = (Executor *)0x0;
      Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked(&lock);
      Thread::~Thread(&thread);
      pEVar2 = ownExecutor.ptr.ptr;
      pDVar1 = ownExecutor.ptr.disposer;
      thread.state = (ThreadState *)ownExecutor.ptr.disposer;
      thread.threadId = (unsigned_long_long)ownExecutor.ptr.ptr;
      ownExecutor.ptr.ptr = (Executor *)0x0;
      if (pEVar2 != (Executor *)0x0) {
        impl.super_Predicate._vptr_Predicate = (_func_int **)ownExecutor.ptr.disposer;
        thread.threadId = 0;
        Own<const_kj::Executor,_std::nullptr_t>::dispose
                  ((Own<const_kj::Executor,_std::nullptr_t> *)&thread);
        in_RDI->_vptr_Disposer = (_func_int **)pDVar1;
        in_RDI[1]._vptr_Disposer = (_func_int **)pEVar2;
        impl.condition = (anon_class_1_0_00000001 *)0x0;
        Own<const_kj::Executor,_std::nullptr_t>::dispose
                  ((Own<const_kj::Executor,_std::nullptr_t> *)&impl);
        Own<const_kj::Executor,_std::nullptr_t>::dispose(&ownExecutor.ptr);
        kj::_::Mutex::~Mutex(&executor.mutex);
        OVar4.ptr = extraout_RDX;
        OVar4.disposer = in_RDI;
        return OVar4;
      }
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
                 ,0x462,FAILED,"kj::mv(ownExecutor) != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_98);
    }
    kj::_::Debug::Fault::Fault
              ((Fault *)&impl,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x45b,FAILED,"ownExecutor != nullptr","");
  }
  kj::_::Debug::Fault::fatal((Fault *)&impl);
}

Assistant:

Own<const Executor> makeDeadExecutor() {
  MutexGuarded<Maybe<const Executor&>> executor;  // to get the Executor from the other thread

  // The other thread's executor, owned by the main thread.
  Maybe<Own<const Executor>> ownExecutor;

  {
    Thread thread([&]() noexcept {
      KJ_XTHREAD_TEST_SETUP_LOOP;

      auto lock = executor.lockExclusive();

      // Give our Executor to the main thread.
      *lock = getCurrentThreadExecutor();

      // Wait for the main thread to tell us it addRef-ed the Executor, then exit.
      lock.wait([&](const Maybe<const Executor&>& value) { return value == kj::none; });
    });

    ([&]() noexcept {
      auto lock = executor.lockExclusive();

      // Get the other thread's Executor.
      lock.wait([&](Maybe<const Executor&> value) { return value != kj::none; });
      ownExecutor = (KJ_ASSERT_NONNULL(*lock)).addRef();

      KJ_EXPECT(KJ_ASSERT_NONNULL(ownExecutor)->isLive());

      // Tell the other thread it can exit now.
      *lock = kj::none;
    })();
  }

  return KJ_ASSERT_NONNULL(kj::mv(ownExecutor));
}